

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

void __thiscall
TRM::Bitmap::ClearWithColor::anon_class_4_1_a7c11e83::operator()
          (anon_class_4_1_a7c11e83 *this,Color *c)

{
  Color *c_local;
  anon_class_4_1_a7c11e83 *this_local;
  
  *(undefined4 *)(c->fRGBA)._M_elems = *(undefined4 *)(this->color).fRGBA._M_elems;
  return;
}

Assistant:

void Bitmap::ReadFromFile(const char *filename) {
  int x, y, n;
  unsigned char *data = stbi_load(filename, &x, &y, &n, 0);
  fPixels.resize(x * y);
  for (int i = 0; i < x; i++) {
    for (int j = 0; j < y; j++) {
      Color color;
      std::memcpy(color.rgba().data(), data + (j * x + i) * n, n);
      if (n < 4) {
        color.rgba()[3] = 255;
      }
      fPixels[j * x + i] = color;
    }
  }

  fWidth = x;
  fHeight = y;
}